

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O0

bool __thiscall
S2ContainsPointQuery<MutableS2ShapeIndex>::VisitContainingShapes
          (S2ContainsPointQuery<MutableS2ShapeIndex> *this,S2Point *p,ShapeVisitor_conflict *visitor
          )

{
  MutableS2ShapeIndex *this_00;
  bool bVar1;
  int iVar2;
  int id;
  S2ShapeIndexCell *this_01;
  S2ClippedShape *clipped_00;
  S2Shape *__args;
  S2ClippedShape *clipped;
  int s;
  int num_clipped;
  S2ShapeIndexCell *cell;
  ShapeVisitor_conflict *visitor_local;
  S2Point *p_local;
  S2ContainsPointQuery<MutableS2ShapeIndex> *this_local;
  
  bVar1 = MutableS2ShapeIndex::Iterator::Locate(&this->it_,p);
  if (bVar1) {
    this_01 = MutableS2ShapeIndex::Iterator::cell(&this->it_);
    iVar2 = S2ShapeIndexCell::num_clipped(this_01);
    for (clipped._0_4_ = 0; (int)clipped < iVar2; clipped._0_4_ = (int)clipped + 1) {
      clipped_00 = S2ShapeIndexCell::clipped(this_01,(int)clipped);
      bVar1 = ShapeContains(this,&this->it_,clipped_00,p);
      if (bVar1) {
        this_00 = this->index_;
        id = S2ClippedShape::shape_id(clipped_00);
        __args = MutableS2ShapeIndex::shape(this_00,id);
        bVar1 = std::function<bool_(S2Shape_*)>::operator()(visitor,__args);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitContainingShapes(
    const S2Point& p, const ShapeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    if (ShapeContains(it_, clipped, p) &&
        !visitor(index_->shape(clipped.shape_id()))) {
      return false;
    }
  }
  return true;
}